

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

bool tcu::x11::glx::checkGLX<bool>(bool value,char *expr,char *file,int line)

{
  TestError *this;
  int line_local;
  char *file_local;
  char *expr_local;
  bool value_local;
  
  if (!value) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    TestError::TestError(this,"GLX call failed",expr,file,line);
    __cxa_throw(this,&TestError::typeinfo,TestError::~TestError);
  }
  return value;
}

Assistant:

static inline T checkGLX(T value, const char* expr, const char* file, int line)
{
	if (!value)
		throw tcu::TestError("GLX call failed", expr, file, line);
	return value;
}